

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::cmServerBase(cmServerBase *this,cmConnection *connection)

{
  int iVar1;
  
  this->_vptr_cmServerBase = (_func_int **)&PTR__cmServerBase_00605330;
  uv_rwlock_init(&(this->ConnectionsMutex)._M_);
  (this->Connections).
  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Connections).
  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->ShutdownSignal).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ShutdownSignal).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ServeThreadId = 0;
  (this->SIGINTHandler).super_uv_handle_ptr_<uv_signal_s>.super_uv_handle_ptr_base_<uv_signal_s>.
  handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->SIGINTHandler).super_uv_handle_ptr_<uv_signal_s>.super_uv_handle_ptr_base_<uv_signal_s>.
  handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->SIGHUPHandler).super_uv_handle_ptr_<uv_signal_s>.super_uv_handle_ptr_base_<uv_signal_s>.
  handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->SIGHUPHandler).super_uv_handle_ptr_<uv_signal_s>.super_uv_handle_ptr_base_<uv_signal_s>.
  handle.super___shared_ptr<uv_signal_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = uv_loop_init(&this->Loop);
  (this->Loop).data = this;
  if (iVar1 == 0) {
    (*this->_vptr_cmServerBase[2])(this,connection);
    return;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                ,0x206,"cmServerBase::cmServerBase(cmConnection *)");
}

Assistant:

cmServerBase::cmServerBase(cmConnection* connection)
{
  auto err = uv_loop_init(&Loop);
  (void)err;
  Loop.data = this;
  assert(err == 0);

  AddNewConnection(connection);
}